

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ListBoxHeader(char *label,int items_count,int height_in_items)

{
  float fVar1;
  bool bVar2;
  ImGuiStyle *pIVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  ImVec2 local_28;
  
  iVar4 = 7;
  if (items_count < 7) {
    iVar4 = items_count;
  }
  if (-1 < height_in_items) {
    iVar4 = height_in_items;
  }
  pIVar3 = GetStyle();
  fVar5 = (float)iVar4;
  if (iVar4 < items_count) {
    fVar5 = fVar5 + 0.25;
  }
  local_28.x = 0.0;
  fVar6 = GetTextLineHeightWithSpacing();
  fVar1 = (pIVar3->FramePadding).y;
  local_28.y = fVar6 * fVar5 + fVar1 + fVar1;
  bVar2 = ListBoxHeader(label,&local_28);
  return bVar2;
}

Assistant:

bool ImGui::ListBoxHeader(const char* label, int items_count, int height_in_items)
{
    // Size default to hold ~7.25 items.
    // We add +25% worth of item height to allow the user to see at a glance if there are more items up/down, without looking at the scrollbar.
    // We don't add this extra bit if items_count <= height_in_items. It is slightly dodgy, because it means a dynamic list of items will make the widget resize occasionally when it crosses that size.
    // I am expecting that someone will come and complain about this behavior in a remote future, then we can advise on a better solution.
    if (height_in_items < 0)
        height_in_items = ImMin(items_count, 7);
    const ImGuiStyle& style = GetStyle();
    float height_in_items_f = (height_in_items < items_count) ? (height_in_items + 0.25f) : (height_in_items + 0.00f);

    // We include ItemSpacing.y so that a list sized for the exact number of items doesn't make a scrollbar appears. We could also enforce that by passing a flag to BeginChild().
    ImVec2 size;
    size.x = 0.0f;
    size.y = GetTextLineHeightWithSpacing() * height_in_items_f + style.FramePadding.y * 2.0f;
    return ListBoxHeader(label, size);
}